

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall GEO::Environment::notify_observers(Environment *this,string *name,bool recursive)

{
  string value;
  string local_40;
  
  get_value(&local_40,this,name);
  notify_observers(this,name,&local_40,recursive);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

bool Environment::notify_observers(
        const std::string& name, bool recursive
    ) {
        std::string value = get_value(name);
        return notify_observers(name, value, recursive);
    }